

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O2

void __thiscall MultiANN::UpdateAnnArray(MultiANN *this)

{
  uint uVar1;
  int n2;
  ANNpointArray points;
  double dVar2;
  bool bVar3;
  int iVar4;
  ulong extraout_RAX;
  ANN *pAVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->size;
  if ((uVar1 & 0xf) == 0 && 0 < (int)uVar1) {
    iVar4 = 0;
    for (uVar7 = 0x1e; 3 < uVar7; uVar7 = uVar7 - 1) {
      if (this->AnnArray[uVar7] != (ANN *)0x0) {
        iVar4 = ANN::LastNode(this->AnnArray[uVar7]);
      }
    }
    uVar7 = (ulong)(iVar4 + 1U);
    if (iVar4 + 1U != this->size) {
      uVar6 = 3;
      bVar3 = false;
      while (uVar7 = CONCAT71((int7)(uVar7 >> 8),0x1e < uVar6 | bVar3), 0x1e >= uVar6 && !bVar3) {
        pAVar5 = this->AnnArray[uVar6 + 1];
        if (pAVar5 == (ANN *)0x0) {
          uVar6 = uVar6 + 1;
          bVar3 = true;
        }
        else {
          ANN::~ANN(pAVar5);
          operator_delete(pAVar5);
          this->AnnArray[uVar6 + 1] = (ANN *)0x0;
          uVar6 = uVar6 + 1;
          uVar7 = extraout_RAX;
        }
      }
      iVar4 = 0;
      if (uVar1 != 0x10) {
        bVar3 = false;
        uVar8 = uVar6;
        while ((uVar8 < 0x1f && (!bVar3))) {
          if (this->AnnArray[uVar8] != (ANN *)0x0) {
            iVar4 = ANN::LastNode(this->AnnArray[uVar8]);
            uVar7 = (ulong)(iVar4 + 1);
            bVar3 = true;
          }
          uVar8 = uVar8 + 1;
        }
        iVar4 = 0;
        if (bVar3) {
          iVar4 = (int)uVar7;
        }
      }
      pAVar5 = (ANN *)operator_new(0x40);
      points = this->points_coor;
      n2 = this->size;
      dVar2 = exp2((double)(int)uVar6);
      ANN::ANN(pAVar5,points,iVar4,n2,(int)dVar2,this->dimension,this->topology,this->scaling,
               this->NumNeighbors);
      this->AnnArray[uVar6 & 0xffffffff] = pAVar5;
    }
  }
  return;
}

Assistant:

void MultiANN::UpdateAnnArray()  // updates the arrays of data points
{
    int j, k, num;
    int n, n_last;
    bool done;

    num = size;
    n_last = 0;  // Just to make warnings go away

    if ((num > 0) && (num % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
                      0)) {  // Check if it is time to update the ANNs

        for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
            if (AnnArray[k])
                n_last = AnnArray[k]->LastNode();  // Make sure update has not
                                                   // been performed
        }
        n_last++;

        if (n_last != size) {  // If equal, then update already performed

            k = ANN_STARTING_INDEX - 1;
            done = false;
            while ((k <= ANN_MAXIMUM_INDEX) && (!done)) {
                k++;
                if (!AnnArray[k]) {  // If there is no tree, then make one
                    done = true;
                } else {
                    delete (AnnArray[k]);  // Blow this one away; these nodes
                                           // are moved up
                    AnnArray[k] = NULL;
                }
            }

            if ((num == ((int)pow((double)2, ANN_STARTING_INDEX))))  // k should
                                                                     // be the
                                                                     // location
                                                                     // for
                                                                     // making
                                                                     // the new
                                                                     // ANN tree
                n = 0;  // Need to find the starting node in G for the new ANN
                        // tree
            else {
                j = k;
                done = false;
                while ((j <= ANN_MAXIMUM_INDEX) && (!done)) {
                    if (AnnArray[j]) {
                        n = AnnArray[j]->LastNode();
                        n++;
                        done = true;
                    }
                    j++;
                }
            }

            if (!done) n = 0;

            AnnArray[k] =
                new ANN(points_coor, n, size, (int)pow((double)2, k), dimension,
                        topology, scaling,
                        NumNeighbors);  // Finally, make the new ANN tree

            // cout << "New ANN Tree:  k: " << k << " num: " << num << "\n";
            // for (j = ANN_MAXIMUM_INDEX; j >= ANN_STARTING_INDEX; j--) {
            // 	cout << (AnnArray[j] ? "X" : ".");
            //}
            // cout << "\n";
        }
    }
}